

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

void ON_XMLNodePrivate::AttemptToFixTag(ON_wString *tag)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  wchar_t *pwVar4;
  ON_wString sNewTag;
  ON_wString sProp;
  ON_wString sName;
  ON_wString OStack_48;
  ON_wString local_40;
  
  pwVar4 = ON_wString::operator_cast_to_wchar_t_(tag);
  GetNameFromTag((ON_XMLNodePrivate *)&stack0xffffffffffffffc8,pwVar4);
  bVar1 = ON_wString::IsEmpty((ON_wString *)&stack0xffffffffffffffc8);
  if (!bVar1) {
    iVar2 = ON_wString::Length(tag);
    if (1 < iVar2) {
      ON_wString::Right(&OStack_48,(int)tag);
      pwVar4 = ON_wString::operator_cast_to_wchar_t_(&OStack_48);
      iVar2 = wcscmp(pwVar4,L"/>");
      ON_wString::~ON_wString(&OStack_48);
      ON_wString::ON_wString(&local_40,L"<");
      ON_wString::operator+(&OStack_48,&local_40);
      ON_wString::~ON_wString(&local_40);
      ON_wString::ON_wString(&local_40);
      iVar3 = 0;
      while( true ) {
        iVar3 = ON_wString::Find(tag,L'=',iVar3);
        if (iVar3 < 0) break;
        bVar1 = RecoverProperty(tag,iVar3,&local_40);
        iVar3 = iVar3 + 1;
        if (bVar1) {
          ON_wString::operator+=(&OStack_48,L" ");
          ON_wString::operator+=(&OStack_48,&local_40);
        }
      }
      pwVar4 = L">";
      if (iVar2 == 0) {
        pwVar4 = L"/>";
      }
      ON_wString::operator+=(&OStack_48,pwVar4);
      ON_wString::operator=(tag,&OStack_48);
      ON_wString::~ON_wString(&local_40);
      ON_wString::~ON_wString(&OStack_48);
    }
  }
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void ON_XMLNodePrivate::AttemptToFixTag(ON_wString& tag) // Static.
{
  // We're going to rebuild the tag from the name and the number of valid properties we find.
  const ON_wString sName = GetNameFromTag(tag);
  if (sName.IsEmpty() || tag.Length() < 2)
    return;

  const bool bSelfClosingTag = (0 == wcscmp(tag.Right(2), L"/>"));

  ON_wString sNewTag = ON_wString(L"<") + sName;

  // Now find all of the potential properties - looking for = signs.
  int pos = 0;
  int equalSign = -1;
  ON_wString sProp;

  while ((equalSign = tag.Find(L'=', pos)) >= 0)
  {
    // Move the search past this one for next time around.
    pos = equalSign + 1;

    if (RecoverProperty(tag, equalSign, sProp))
    {
      sNewTag += L" ";
      sNewTag += sProp;
    }
  }

  if (bSelfClosingTag)
  {
    sNewTag += L"/>";
  }
  else
  {
    sNewTag += L">";
  }

  tag = sNewTag;
}